

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_read_stream.hpp
# Opt level: O3

size_type __thiscall
io::buffered_read_stream<io::posix::file,_std::allocator<unsigned_char>_>::fill
          (buffered_read_stream<io::posix::file,_std::allocator<unsigned_char>_> *this,
          error_code *ec)

{
  buffer_type *this_00;
  ulong uVar1;
  pointer puVar2;
  size_type sVar3;
  size_type sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
  resize_guard;
  buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_> local_40
  ;
  mutable_buffer local_30;
  
  this_00 = &this->storage_;
  uVar9 = (this->storage_).end_ - (this->storage_).begin_;
  local_40.buf_ = this_00;
  local_40.old_size_ = uVar9;
  detail::buffered_stream_storage<std::allocator<unsigned_char>_>::resize
            (this_00,(long)(this->storage_).vec_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->storage_).vec_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  uVar1 = (this->storage_).begin_;
  puVar2 = (this->storage_).vec_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(this->storage_).vec_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  local_30.data_ = (pointer)0x0;
  if (uVar8 != 0) {
    local_30.data_ = puVar2;
  }
  uVar6 = uVar1;
  if (uVar8 < uVar1) {
    uVar6 = uVar8;
  }
  uVar8 = uVar8 - uVar6;
  uVar7 = uVar9;
  if (uVar8 < uVar9) {
    uVar7 = uVar8;
  }
  local_30.data_ = (void *)((long)local_30.data_ + uVar7 + uVar6);
  local_30.size_ = (uVar9 - uVar1) + (this->storage_).end_;
  if (uVar8 - uVar7 < local_30.size_) {
    local_30.size_ = uVar8 - uVar7;
  }
  sVar5 = posix::file::read_some(&this->base_,&local_30,ec);
  detail::buffered_stream_storage<std::allocator<unsigned_char>_>::resize(this_00,sVar5 + uVar9);
  local_40.old_size_ = 0xffffffffffffffff;
  sVar3 = (this->storage_).end_;
  sVar4 = (this->storage_).begin_;
  detail::buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
  ::~buffer_resize_guard(&local_40);
  return sVar3 - (uVar9 + sVar4);
}

Assistant:

size_type fill(std::error_code& ec)
    {
        detail::buffer_resize_guard<buffer_type> resize_guard(storage_);
        auto prev_size = storage_.size();
        storage_.resize(storage_.capacity()); // ?
        storage_.resize(prev_size +
                base_.read_some(io::buffer(
                storage_.data() + prev_size,
                storage_.size() + prev_size),
                                ec
        ));
        resize_guard.commit();
        return storage_.size() - prev_size;
    }